

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyDefinitionMap.cxx
# Opt level: O0

void __thiscall
cmPropertyDefinitionMap::DefineProperty
          (cmPropertyDefinitionMap *this,string *name,ScopeType scope,char *ShortDescription,
          char *FullDescription,bool chain)

{
  bool bVar1;
  _Self local_50;
  mapped_type *local_48;
  cmPropertyDefinition *prop;
  iterator it;
  bool chain_local;
  char *FullDescription_local;
  char *ShortDescription_local;
  ScopeType scope_local;
  string *name_local;
  cmPropertyDefinitionMap *this_local;
  
  it._M_node._7_1_ = chain;
  prop = (cmPropertyDefinition *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
         ::find(&this->
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
                ,name);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
       ::end(&this->
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
            );
  bVar1 = std::operator==((_Self *)&prop,&local_50);
  if (bVar1) {
    local_48 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
               ::operator[](&this->
                             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
                            ,name);
    cmPropertyDefinition::DefineProperty
              (local_48,name,scope,ShortDescription,FullDescription,(bool)(it._M_node._7_1_ & 1));
  }
  return;
}

Assistant:

void cmPropertyDefinitionMap
::DefineProperty(const std::string& name, cmProperty::ScopeType scope,
                 const char *ShortDescription,
                 const char *FullDescription,
                 bool chain)
{
  cmPropertyDefinitionMap::iterator it = this->find(name);
  cmPropertyDefinition *prop;
  if (it == this->end())
    {
    prop = &(*this)[name];
    prop->DefineProperty(name,scope,ShortDescription, FullDescription,
                         chain);
    }
}